

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O0

Test * __thiscall CppUnit::TestFactoryRegistry::makeTest(TestFactoryRegistry *this)

{
  TestSuite *this_00;
  string local_38;
  TestSuite *local_18;
  TestSuite *suite;
  TestFactoryRegistry *this_local;
  
  suite = (TestSuite *)this;
  this_00 = (TestSuite *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_38,(string *)&this->m_name);
  TestSuite::TestSuite(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_18 = this_00;
  addTestToSuite(this,this_00);
  return (Test *)local_18;
}

Assistant:

Test *
TestFactoryRegistry::makeTest()
{
  TestSuite *suite = new TestSuite( m_name );
  addTestToSuite( suite );
  return suite;
}